

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLine::SectionParser::SectionParser
          (SectionParser *this,DWARFDataExtractor *Data,DWARFContext *C,cu_range CUs,tu_range TUs)

{
  bool bVar1;
  tu_range local_90 [2];
  cu_range local_70;
  LineToUnitMap local_60;
  DWARFContext *local_30;
  DWARFContext *C_local;
  DWARFDataExtractor *Data_local;
  SectionParser *this_local;
  cu_range CUs_local;
  
  CUs_local.begin_iterator = CUs.end_iterator;
  this_local = (SectionParser *)CUs.begin_iterator;
  local_30 = C;
  C_local = (DWARFContext *)Data;
  Data_local = (DWARFDataExtractor *)this;
  std::
  map<unsigned_long,_llvm::DWARFUnit_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::map(&this->LineToUnit);
  this->DebugLineData = (DWARFDataExtractor *)C_local;
  this->Context = local_30;
  this->Offset = 0;
  this->Done = false;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>::
  iterator_range<llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>&>
            ((iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
              *)&local_70,
             (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
              *)&this_local);
  iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>::
  iterator_range<llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>&>
            ((iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
              *)local_90,&TUs);
  buildLineToUnitMap(&local_60,local_70,local_90[0]);
  std::
  map<unsigned_long,_llvm::DWARFUnit_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::operator=(&this->LineToUnit,&local_60);
  std::
  map<unsigned_long,_llvm::DWARFUnit_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFUnit_*>_>_>
  ::~map(&local_60);
  bVar1 = DataExtractor::isValidOffset(&this->DebugLineData->super_DataExtractor,this->Offset);
  if (!bVar1) {
    this->Done = true;
  }
  return;
}

Assistant:

DWARFDebugLine::SectionParser::SectionParser(DWARFDataExtractor &Data,
                                             const DWARFContext &C,
                                             cu_range CUs, tu_range TUs)
    : DebugLineData(Data), Context(C) {
  LineToUnit = buildLineToUnitMap(CUs, TUs);
  if (!DebugLineData.isValidOffset(Offset))
    Done = true;
}